

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GroupStackDepthQueryCase::iterate
          (GroupStackDepthQueryCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_c2;
  allocator<char> local_c1;
  ScopedLogSection section;
  string local_b8;
  CallLogWrapper gl;
  string local_80;
  ResultCollector result;
  
  bVar2 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (bVar2) {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    glu::CallLogWrapper::CallLogWrapper
              (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8," // ERROR: ",(allocator<char> *)&local_80);
    tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    gl.m_enableLog = true;
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Initial",&local_c1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Initial",&local_c2);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_b8,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_b8);
    gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x826d,1,this->m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Scoped",&local_c1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Scoped",&local_c2);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_b8,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_b8);
    glu::CallLogWrapper::glPushDebugGroup(&gl,0x824a,1,-1,"Application group 1");
    gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x826d,2,this->m_type);
    glu::CallLogWrapper::glPopDebugGroup(&gl);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    tcu::ResultCollector::setTestContextResult
              (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::ResultCollector::~ResultCollector(&result);
    glu::CallLogWrapper::~CallLogWrapper(&gl);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0xadb);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GroupStackDepthQueryCase::IterateResult GroupStackDepthQueryCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Initial", "Initial");

		gls::StateQueryUtil::verifyStateInteger(result, gl, GL_DEBUG_GROUP_STACK_DEPTH, 1, m_type);
	}

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Scoped", "Scoped");

		gl.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 1, -1, "Application group 1");
		gls::StateQueryUtil::verifyStateInteger(result, gl, GL_DEBUG_GROUP_STACK_DEPTH, 2, m_type);
		gl.glPopDebugGroup();
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}